

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void pcmpestri_(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    failDecode(pMyDisasm);
  }
  else if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      verifyVEXvvvv(pMyDisasm);
      if ((pMyDisasm->Reserved_).VEX.L != '\0') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x11000d;
      strcpy((pMyDisasm->Instruction).Mnemonic,"vpcmpestri");
      (pMyDisasm->Operand1).AccessMode = 1;
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x6d;
    (pMyDisasm->Instruction).Category = 0x9000d;
    strcpy((pMyDisasm->Instruction).Mnemonic,"pcmpestri");
    (pMyDisasm->Operand1).AccessMode = 1;
    (pMyDisasm->Reserved_).Register_ = 4;
    GxEx(pMyDisasm);
    getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
  }
  else {
    failDecode(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ pcmpestri_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  }
  else if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      verifyVEXvvvv(pMyDisasm);
      if (GV.VEX.L != 0) GV.ERROR_OPCODE = UD_;
      GV.MemDecoration = Arg2_m128_xmm;
      pMyDisasm->Instruction.Category = AVX_INSTRUCTION+COMPARISON_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpcmpestri");
      #endif
      pMyDisasm->Operand1.AccessMode = READ;
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }

   /* ========== 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       GV.MemDecoration = Arg2_m128_xmm;
       pMyDisasm->Instruction.Category = SSE42_INSTRUCTION+COMPARISON_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pcmpestri");
       #endif
       pMyDisasm->Operand1.AccessMode = READ;
       GV.Register_ = SSE_REG;
       GxEx(pMyDisasm);

       getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
   }
   else {
       failDecode(pMyDisasm);
   }

}